

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

void mtbdd_gc_mark_external_refs_CALL(WorkerP *w,Task *__dq_head)

{
  uint64_t arg_1;
  long lVar1;
  uint64_t *it;
  uint64_t *local_30;
  
  lVar1 = 0;
  local_30 = refs_iter(&mtbdd_refs,0,mtbdd_refs.refs_size);
  while (local_30 != (uint64_t *)0x0) {
    arg_1 = refs_next(&mtbdd_refs,&local_30,mtbdd_refs.refs_size);
    mtbdd_gc_mark_rec_SPAWN(w,__dq_head,arg_1);
    __dq_head = __dq_head + 1;
    lVar1 = lVar1 + -1;
  }
  for (; __dq_head = __dq_head + -1, lVar1 != 0; lVar1 = lVar1 + 1) {
    mtbdd_gc_mark_rec_SYNC(w,__dq_head);
  }
  return;
}

Assistant:

VOID_TASK_0(mtbdd_gc_mark_external_refs)
{
    // iterate through refs hash table, mark all found
    size_t count=0;
    uint64_t *it = refs_iter(&mtbdd_refs, 0, mtbdd_refs.refs_size);
    while (it != NULL) {
        SPAWN(mtbdd_gc_mark_rec, refs_next(&mtbdd_refs, &it, mtbdd_refs.refs_size));
        count++;
    }
    while (count--) {
        SYNC(mtbdd_gc_mark_rec);
    }
}